

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void tlb_set_page_with_attrs_m68k
               (CPUState *cpu,target_ulong_conflict vaddr,hwaddr paddr,MemTxAttrs attrs,int prot,
               int mmu_idx,target_ulong_conflict size)

{
  undefined4 *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  _Bool _Var5;
  uint uVar6;
  void *pvVar7;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int asidx;
  MemoryRegionSection *section;
  void *pvVar17;
  ram_addr_t rVar18;
  hwaddr hVar19;
  long *plVar20;
  uint uVar21;
  uint uVar22;
  undefined4 in_register_00000034;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  ulong addr;
  long lVar26;
  CPUState *cpu_00;
  uint uVar27;
  hwaddr xlat;
  MemTxAttrs in_stack_ffffffffffffff68;
  uint local_88;
  uint local_84;
  CPUState *local_80;
  ulong local_78;
  hwaddr local_70;
  MemTxAttrs local_64;
  long local_60;
  long local_58;
  long local_50;
  uint *local_48;
  ulong local_40;
  ulong local_38;
  
  local_78 = CONCAT44(in_register_00000034,vaddr);
  pvVar7 = cpu->env_ptr;
  p_Var8 = cpu->cc->asidx_from_attrs;
  local_84 = prot;
  if (p_Var8 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
    asidx = 0;
  }
  else {
    asidx = (*p_Var8)((CPUState_conflict *)cpu,in_stack_ffffffffffffff68);
    if ((asidx < 0) || (cpu->num_ases <= asidx)) {
      __assert_fail("ret < cpu->num_ases && ret >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                    ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
    }
  }
  local_58 = (long)mmu_idx;
  local_50 = local_58 * 0x2b0;
  local_48 = (uint *)((long)pvVar7 + local_50 + -0x590);
  local_38 = 0x1000;
  if (0x1000 < size) {
    uVar22 = *(uint *)((long)pvVar7 + local_50 + -0x590);
    uVar21 = -size;
    uVar27 = (uint)local_78;
    if (uVar22 != 0xffffffff) {
      uVar6 = uVar21 & *(uint *)((long)pvVar7 + local_50 + -0x58c);
      do {
        uVar21 = uVar6;
        uVar27 = uVar22;
        uVar6 = uVar21 * 2;
      } while ((uVar21 & (uVar22 ^ (uint)local_78)) != 0);
    }
    *local_48 = uVar27 & uVar21;
    *(uint *)((long)pvVar7 + local_50 + -0x58c) = uVar21;
    local_38 = (ulong)size;
  }
  local_40 = (ulong)((uint)paddr & 0xfffff000);
  local_80 = cpu;
  section = address_space_translate_for_iotlb_m68k
                      (cpu,asidx,local_40,&local_70,&local_38,attrs,(int *)&local_84);
  if (local_38 < 0x1000) {
    __assert_fail("sz >= TARGET_PAGE_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                  ,0x322,
                  "void tlb_set_page_with_attrs_m68k(CPUState *, target_ulong, hwaddr, MemTxAttrs, int, int, target_ulong)"
                 );
  }
  uVar27 = (uint)local_78 & 0xfffff000;
  uVar22 = uVar27 | 0x800;
  if (0xfff < size) {
    uVar22 = uVar27;
  }
  _Var5 = section->mr->ram;
  local_64 = attrs;
  if (_Var5 == true) {
    pvVar17 = memory_region_get_ram_ptr_m68k(section->mr);
    local_60 = (long)pvVar17 + local_70;
  }
  else {
    local_60 = 0;
  }
  cpu_00 = local_80;
  uVar22 = uVar22 | (uint)attrs >> 0xc & 0x80;
  if (_Var5 == false) {
    hVar19 = memory_region_section_get_iotlb_m68k(local_80,section);
    lVar26 = hVar19 + local_70;
    uVar22 = uVar22 | 0x200;
    local_88 = uVar22;
  }
  else {
    rVar18 = memory_region_get_ram_addr_m68k(section->mr);
    lVar26 = rVar18 + local_70;
    cpu_00 = local_80;
    local_88 = uVar22;
    if ((local_84 & 2) != 0) {
      if (section->readonly == true) {
        local_88 = uVar22 | 0x40;
      }
      else {
        local_88 = uVar22 | 0x400;
      }
    }
  }
  addr = (ulong)uVar27;
  uVar21 = cpu_watchpoint_address_matches_m68k(cpu_00,addr,0x1000);
  uVar23 = *(ulong *)((long)pvVar7 + local_58 * 0x10 + -0x30);
  lVar9 = *(long *)((long)pvVar7 + local_58 * 0x10 + -0x28);
  *(ushort *)((long)pvVar7 + -0x5b0) =
       *(ushort *)((long)pvVar7 + -0x5b0) | (ushort)(1 << ((byte)local_58 & 0x1f));
  plVar20 = (long *)((long)pvVar7 + local_50 + -0x578);
  lVar24 = 0;
  do {
    if ((((*(uint *)((long)pvVar7 + lVar24 + local_50 + -0x568) & 0xfffff800) == uVar27) ||
        ((*(uint *)((long)pvVar7 + lVar24 + local_50 + -0x564) & 0xfffff800) == uVar27)) ||
       ((*(uint *)((long)pvVar7 + lVar24 + local_50 + -0x560) & 0xfffff800) == uVar27)) {
      puVar1 = (undefined4 *)((long)pvVar7 + lVar24 + local_50 + -0x568);
      puVar1[0xc] = 0xffffffff;
      puVar1[0xd] = 0xffffffff;
      puVar1[0xe] = 0xffffffff;
      puVar1[0xf] = 0xffffffff;
      puVar1[8] = 0xffffffff;
      puVar1[9] = 0xffffffff;
      puVar1[10] = 0xffffffff;
      puVar1[0xb] = 0xffffffff;
      puVar1[4] = 0xffffffff;
      puVar1[5] = 0xffffffff;
      puVar1[6] = 0xffffffff;
      puVar1[7] = 0xffffffff;
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      *plVar20 = *plVar20 + -1;
    }
    lVar24 = lVar24 + 0x40;
  } while (lVar24 != 0x200);
  uVar25 = (uint)(local_78 >> 0xc) & 0xfffff & (uint)(uVar23 >> 6) & 0x3ffffff;
  puVar2 = (uint *)(lVar9 + (ulong)(uVar25 << 6));
  uVar6 = *(uint *)(lVar9 + (ulong)(uVar25 << 6));
  if (((((uVar6 & 0xfffff800) != uVar27) && ((puVar2[1] & 0xfffff800) != uVar27)) &&
      ((puVar2[2] & 0xfffff800) != uVar27)) &&
     (((uVar6 != 0xffffffff || (puVar2[1] != 0xffffffff)) || (puVar2[2] != 0xffffffff)))) {
    lVar9 = *(long *)(local_48 + 8);
    *(long *)(local_48 + 8) = lVar9 + 1;
    uVar27 = (uint)lVar9 & 7;
    uVar23 = (ulong)(uVar27 << 6);
    uVar10 = *(undefined8 *)puVar2;
    uVar11 = *(undefined8 *)(puVar2 + 2);
    uVar12 = *(undefined8 *)(puVar2 + 4);
    uVar13 = *(undefined8 *)(puVar2 + 6);
    uVar14 = *(undefined8 *)(puVar2 + 8);
    uVar15 = *(undefined8 *)(puVar2 + 10);
    uVar16 = *(undefined8 *)(puVar2 + 0xe);
    puVar3 = (undefined8 *)((long)local_48 + uVar23 + 0x58);
    *puVar3 = *(undefined8 *)(puVar2 + 0xc);
    puVar3[1] = uVar16;
    puVar3 = (undefined8 *)((long)local_48 + uVar23 + 0x48);
    *puVar3 = uVar14;
    puVar3[1] = uVar15;
    puVar3 = (undefined8 *)((long)local_48 + uVar23 + 0x38);
    *puVar3 = uVar12;
    puVar3[1] = uVar13;
    puVar3 = (undefined8 *)((long)local_48 + uVar23 + 0x28);
    *puVar3 = uVar10;
    puVar3[1] = uVar11;
    puVar3 = (undefined8 *)(*(long *)(local_48 + 0xaa) + (ulong)(uVar25 << 4));
    uVar10 = puVar3[1];
    puVar4 = (undefined8 *)((long)local_48 + (ulong)(uVar27 << 4) + 0x228);
    *puVar4 = *puVar3;
    puVar4[1] = uVar10;
    *plVar20 = *plVar20 + -1;
  }
  lVar9 = *(long *)(local_48 + 0xaa);
  *(ulong *)(lVar9 + (ulong)(uVar25 << 4)) = lVar26 - addr;
  *(MemTxAttrs *)(lVar9 + 8 + (ulong)(uVar25 << 4)) = local_64;
  uVar27 = 0xffffffff;
  if ((local_84 & 2) != 0) {
    uVar27 = (uVar21 & 2) << 7 | local_88 | (local_84 & 0x40) << 5;
  }
  *puVar2 = -(uint)((local_84 & 1) == 0) | (uVar21 & 1) << 8 | uVar22;
  puVar2[1] = uVar27;
  puVar2[2] = -(uint)((local_84 & 4) == 0) | uVar22;
  puVar2[3] = (uint)local_40;
  *(ulong *)(puVar2 + 4) = local_60 - addr;
  *plVar20 = *plVar20 + 1;
  return;
}

Assistant:

void tlb_set_page_with_attrs(CPUState *cpu, target_ulong vaddr,
                             hwaddr paddr, MemTxAttrs attrs, int prot,
                             int mmu_idx, target_ulong size)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    CPUTLB *tlb = env_tlb(env);
    CPUTLBDesc *desc = &tlb->d[mmu_idx];
    MemoryRegionSection *section;
    unsigned int index;
    target_ulong address;
    target_ulong write_address;
    uintptr_t addend;
    CPUTLBEntry *te, tn;
    hwaddr iotlb, xlat, sz, paddr_page;
    target_ulong vaddr_page;
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    int wp_flags;
    bool is_ram;

    // assert_cpu_is_self(cpu);

    if (size <= TARGET_PAGE_SIZE) {
        sz = TARGET_PAGE_SIZE;
    } else {
        tlb_add_large_page(env, mmu_idx, vaddr, size);
        sz = size;
    }
    vaddr_page = vaddr & TARGET_PAGE_MASK;
    paddr_page = paddr & TARGET_PAGE_MASK;

    section = address_space_translate_for_iotlb(cpu, asidx, paddr_page,
                                                &xlat, &sz, attrs, &prot);
    assert(sz >= TARGET_PAGE_SIZE);

    address = vaddr_page;
    if (size < TARGET_PAGE_SIZE) {
        /* Repeat the MMU check and TLB fill on every access.  */
        address |= TLB_INVALID_MASK;
    }
    if (attrs.byte_swap) {
        address |= TLB_BSWAP;
    }

    is_ram = memory_region_is_ram(section->mr);
    // is_romd = memory_region_is_romd(section->mr);

    if (is_ram) {
        /* RAM and ROMD both have associated host memory. */
        addend = (uintptr_t)memory_region_get_ram_ptr(section->mr) + xlat;
    } else {
        /* I/O does not; force the host address to NULL. */
        addend = 0;
    }

    write_address = address;
    if (is_ram) {
        iotlb = memory_region_get_ram_addr(section->mr) + xlat;
        /*
         * Computing is_clean is expensive; avoid all that unless
         * the page is actually writable.
         */
        if (prot & PAGE_WRITE) {
            if (section->readonly) {
                write_address |= TLB_DISCARD_WRITE;
            } else if (cpu_physical_memory_is_clean(iotlb)) {
                write_address |= TLB_NOTDIRTY;
            }
        }
    } else {
        /* I/O or ROMD */
        iotlb = memory_region_section_get_iotlb(cpu, section) + xlat;
        /*
         * Writes to romd devices must go through MMIO to enable write.
         * Reads to romd devices go through the ram_ptr found above,
         * but of course reads to I/O must go through MMIO.
         */
        write_address |= TLB_MMIO;
        //if (!is_romd) {
            address = write_address;
        //}
    }

    wp_flags = cpu_watchpoint_address_matches(cpu, vaddr_page,
                                              TARGET_PAGE_SIZE);

    index = tlb_index(env, mmu_idx, vaddr_page);
    te = tlb_entry(env, mmu_idx, vaddr_page);

    /* Note that the tlb is no longer clean.  */
    tlb->c.dirty |= 1 << mmu_idx;

    /* Make sure there's no cached translation for the new page.  */
    tlb_flush_vtlb_page_locked(env, mmu_idx, vaddr_page);

    /*
     * Only evict the old entry to the victim tlb if it's for a
     * different page; otherwise just overwrite the stale data.
     */
    if (!tlb_hit_page_anyprot(env->uc, te, vaddr_page) && !tlb_entry_is_empty(te)) {
        unsigned vidx = desc->vindex++ % CPU_VTLB_SIZE;
        CPUTLBEntry *tv = &desc->vtable[vidx];

        /* Evict the old entry into the victim tlb.  */
        copy_tlb_helper_locked(tv, te);
        desc->viotlb[vidx] = desc->iotlb[index];
        tlb_n_used_entries_dec(env, mmu_idx);
    }

    /* refill the tlb */
    /*
     * At this point iotlb contains a physical section number in the lower
     * TARGET_PAGE_BITS, and either
     *  + the ram_addr_t of the page base of the target RAM (RAM)
     *  + the offset within section->mr of the page base (I/O, ROMD)
     * We subtract the vaddr_page (which is page aligned and thus won't
     * disturb the low bits) to give an offset which can be added to the
     * (non-page-aligned) vaddr of the eventual memory access to get
     * the MemoryRegion offset for the access. Note that the vaddr we
     * subtract here is that of the page base, and not the same as the
     * vaddr we add back in io_readx()/io_writex()/get_page_addr_code().
     */
    desc->iotlb[index].addr = iotlb - vaddr_page;
    desc->iotlb[index].attrs = attrs;

    /* Now calculate the new entry */
    tn.addend = addend - vaddr_page;
    tn.paddr = paddr_page;
    if (prot & PAGE_READ) {
        tn.addr_read = address;
        if (wp_flags & BP_MEM_READ) {
            tn.addr_read |= TLB_WATCHPOINT;
        }
    } else {
        tn.addr_read = -1;
    }

    if (prot & PAGE_EXEC) {
        tn.addr_code = address;
    } else {
        tn.addr_code = -1;
    }

    tn.addr_write = -1;
    if (prot & PAGE_WRITE) {
        tn.addr_write = write_address;
        if (prot & PAGE_WRITE_INV) {
            tn.addr_write |= TLB_INVALID_MASK;
        }
        if (wp_flags & BP_MEM_WRITE) {
            tn.addr_write |= TLB_WATCHPOINT;
        }
    }

    copy_tlb_helper_locked(te, &tn);
    tlb_n_used_entries_inc(env, mmu_idx);
}